

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootup.c
# Opt level: O2

void __thiscall CMud::LoadOptions(CMud *this)

{
  Config *this_00;
  int iVar1;
  string local_38;
  
  this_00 = &this->Settings;
  Config::GetValue_abi_cxx11_(&local_38,this_00,"Port");
  iVar1 = std::__cxx11::stoi(&local_38,(size_t *)0x0,10);
  this->game_port = iVar1;
  std::__cxx11::string::~string((string *)&local_38);
  Config::GetValue_abi_cxx11_(&local_38,this_00,"BaseDir");
  RString::operator=(&this->base_directory,local_38._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_38);
  Config::GetValue_abi_cxx11_(&local_38,this_00,"PlayerDir");
  RString::operator=(&this->player_dir,local_38._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void CMud::LoadOptions()
{
	game_port = stoi(Settings.GetValue("Port"));
	base_directory = (Settings.GetValue("BaseDir").c_str());
	player_dir = (Settings.GetValue("PlayerDir").c_str());
}